

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O2

expected<void,_std::error_code> * __thiscall
jaegertracing::Tracer::Inject
          (expected<void,_std::error_code> *__return_storage_ptr__,Tracer *this,SpanContext *ctx,
          ostream *writer)

{
  error_category *peVar1;
  SpanContext *ctx_00;
  
  ctx_00 = (SpanContext *)
           __dynamic_cast(ctx,&opentracing::v3::SpanContext::typeinfo,&SpanContext::typeinfo,0);
  peVar1 = DAT_002a5f18;
  if (ctx_00 == (SpanContext *)0x0) {
    (__return_storage_ptr__->contained).m_error._M_value =
         opentracing::v3::invalid_span_context_error;
    (__return_storage_ptr__->contained).m_error._M_cat = peVar1;
  }
  else {
    propagation::BinaryPropagator::inject(&this->_binaryPropagator,ctx_00,writer);
  }
  __return_storage_ptr__->has_value_ = ctx_00 != (SpanContext *)0x0;
  return __return_storage_ptr__;
}

Assistant:

opentracing::expected<void> Inject(const opentracing::SpanContext& ctx,
                                       std::ostream& writer) const override
    {
        const auto* jaegerCtx = dynamic_cast<const SpanContext*>(&ctx);
        if (!jaegerCtx) {
            return opentracing::make_expected_from_error<void>(
                opentracing::invalid_span_context_error);
        }
        _binaryPropagator.inject(*jaegerCtx, writer);
        return opentracing::make_expected();
    }